

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O2

void __thiscall llvm::yaml::Scanner::scan_ns_uri_char(Scanner *this)

{
  byte bVar1;
  bool bVar2;
  size_type sVar3;
  byte *pbVar4;
  StringRef Chars;
  StringRef local_40;
  
  pbVar4 = (byte *)this->Current;
  do {
    if (pbVar4 == (byte *)this->End) {
      return;
    }
    bVar1 = *pbVar4;
    if (((((bVar1 != 0x25) || (this->End <= pbVar4 + 2)) ||
         (bVar2 = is_ns_hex_digit(pbVar4[1]), !bVar2)) ||
        (bVar2 = is_ns_hex_digit(pbVar4[2]), !bVar2)) &&
       ((bVar1 != 0x2d && (0x19 < (byte)((bVar1 & 0xdf) + 0xbf))))) {
      local_40.Length = 1;
      Chars.Length = 0x15;
      Chars.Data = "#;/?:@&=+$,_.!~*\'()[]";
      local_40.Data = (char *)pbVar4;
      sVar3 = StringRef::find_first_of(&local_40,Chars,0);
      if (sVar3 == 0xffffffffffffffff) {
        return;
      }
      pbVar4 = (byte *)this->Current;
    }
    pbVar4 = pbVar4 + 1;
    this->Current = (iterator)pbVar4;
    this->Column = this->Column + 1;
  } while( true );
}

Assistant:

void Scanner::scan_ns_uri_char() {
  while (true) {
    if (Current == End)
      break;
    if ((   *Current == '%'
          && Current + 2 < End
          && is_ns_hex_digit(*(Current + 1))
          && is_ns_hex_digit(*(Current + 2)))
        || is_ns_word_char(*Current)
        || StringRef(Current, 1).find_first_of("#;/?:@&=+$,_.!~*'()[]")
          != StringRef::npos) {
      ++Current;
      ++Column;
    } else
      break;
  }
}